

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *window_00;
  code *pcVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  undefined1 uVar4;
  ImGuiID in_ESI;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_00000010;
  float in_stack_00000060;
  ImDrawCornerFlags in_stack_00000064;
  float in_stack_00000068;
  ImU32 in_stack_0000006c;
  ImVec2 *in_stack_00000070;
  ImVec2 *in_stack_00000078;
  ImDrawList *in_stack_00000080;
  
  pIVar2 = GImGui;
  if ((((((GImGui->HoveredId != 0) && (GImGui->HoveredId != in_ESI)) &&
        ((GImGui->HoveredIdAllowOverlap & 1U) == 0)) ||
       (window_00 = GImGui->CurrentWindow, GImGui->HoveredWindow != window_00)) ||
      (((GImGui->ActiveId != 0 && (GImGui->ActiveId != in_ESI)) &&
       ((GImGui->ActiveIdAllowOverlap & 1U) == 0)))) ||
     (((bVar3 = IsMouseHoveringRect(&bb->Min,(ImVec2 *)CONCAT44(id,in_stack_00000010),g._7_1_),
       !bVar3 || ((pIVar2->NavDisableMouseHover & 1U) != 0)) ||
      (bVar3 = IsWindowContentHoverable(window_00,0), !bVar3)))) {
    return false;
  }
  if (((window_00->DC).ItemFlags & 4U) != 0) {
    return false;
  }
  SetHoveredID(in_ESI);
  if (((pIVar2->DebugItemPickerActive & 1U) != 0) && (pIVar2->HoveredIdPreviousFrame == in_ESI)) {
    GetForegroundDrawList();
    ImDrawList::AddRect(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006c,
                        in_stack_00000068,in_stack_00000064,in_stack_00000060);
  }
  if (pIVar2->DebugItemPickerBreakId == in_ESI) {
    pcVar1 = (code *)swi(3);
    uVar4 = (*pcVar1)();
    return (bool)uVar4;
  }
  return true;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;
    if (g.NavDisableMouseHover || !IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
        return false;
    if (window->DC.ItemFlags & ImGuiItemFlags_Disabled)
        return false;

    SetHoveredID(id);

    // [DEBUG] Item Picker tool!
    // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
    // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
    // items if we perform the test in ItemAdd(), but that would incur a small runtime cost.
    // #define IMGUI_DEBUG_TOOL_ITEM_PICKER_EX in imconfig.h if you want this check to also be performed in ItemAdd().
    if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
        GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
    if (g.DebugItemPickerBreakId == id)
        IM_DEBUG_BREAK();

    return true;
}